

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void clear_suite::clear_overfull(void)

{
  size_type local_78;
  undefined4 local_6c;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,2);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,3);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,4);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,5);
  local_78 = span.member.cap;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9b2,"void clear_suite::clear_overfull()",&local_78,&local_6c);
  local_78 = span.member.size;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9b3,"void clear_suite::clear_overfull()",&local_78,&local_6c);
  span.member.size = 0;
  span.member.next = span.member.cap;
  local_78 = span.member.cap;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9b5,"void clear_suite::clear_overfull()",&local_78,&local_6c);
  local_78 = span.member.size;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9b6,"void clear_suite::clear_overfull()",&local_78,&local_6c);
  return;
}

Assistant:

void clear_overfull()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(1);
    span.push_back(2);
    span.push_back(3);
    span.push_back(4);
    span.push_back(5);
    BOOST_TEST_EQ(span.capacity(), 4);
    BOOST_TEST_EQ(span.size(), 4);
    span.clear();
    BOOST_TEST_EQ(span.capacity(), 4);
    BOOST_TEST_EQ(span.size(), 0);
}